

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O0

void TPZShapeHDiv<pzshape::TPZShapePrism>::ComputeVecandShape(TPZShapeData *data)

{
  int iVar1;
  int64_t iVar2;
  int *piVar3;
  long lVar4;
  long *plVar5;
  pair<int,_long> *ppVar6;
  ostream *poVar7;
  void *this;
  long in_RDI;
  int ivs;
  int maxd_1;
  int maxd;
  int d_1;
  int include_1;
  int shord [3];
  int maxorder [3];
  int sidedimension_1;
  int ish_1;
  int lastshape_1;
  int firstshape_1;
  MElementType tipo;
  int dir;
  int bil;
  int side_2;
  int ivec_1;
  int locvec_1;
  int d;
  int include;
  int sidedimension;
  int ish;
  int lastshape;
  int firstshape;
  int order;
  int connectindex;
  int face;
  int side_1;
  int ivec;
  int locvec;
  int firstface;
  int64_t nvec;
  TPZManVector<long,_27> FirstIndex;
  int scalarorder;
  TPZGenMatrix<int> shapeorders;
  int i;
  int counthold;
  TPZManVector<int,_27> permgather;
  int nlowdim;
  TPZStack<int,_10> smallsides;
  int side;
  int count;
  TPZManVector<int,_81> vecpermute;
  TPZManVector<int,_10> facevector;
  int nexternalvectors;
  int nshape;
  int pressureorder;
  TPZManVector<int,_63> normalsides;
  TPZManVector<int,_63> directions;
  TPZManVector<int,_63> bilinear;
  TPZManVector<int,_63> VectorSides;
  int64_t numvec;
  int *in_stack_fffffffffffff568;
  TPZManVector<int,_81> *in_stack_fffffffffffff570;
  TPZGenMatrix<int> *in_stack_fffffffffffff578;
  TPZStack<int,_10> *in_stack_fffffffffffff580;
  TPZVec<int> *in_stack_fffffffffffff588;
  TPZManVector<int,_81> *in_stack_fffffffffffff590;
  TPZVec<int> *in_stack_fffffffffffff598;
  TPZManVector<int,_10> *in_stack_fffffffffffff5a0;
  TPZGenMatrix<int> *in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5ec;
  TPZVec<long> *in_stack_fffffffffffff5f0;
  TPZVec<int> *in_stack_fffffffffffff600;
  TPZShapeData *in_stack_fffffffffffff608;
  undefined8 in_stack_fffffffffffff610;
  pair<int,_int> local_90c;
  int local_904;
  int local_900;
  int local_8fc;
  int local_8f8;
  int local_8f4 [4];
  int local_8e4;
  int local_8e0;
  int local_8dc;
  int local_8d8;
  int local_8d4;
  int local_8d0;
  MElementType local_8cc;
  int local_8c8;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  int local_8b8;
  pair<int,_int> local_8b4;
  int local_8ac;
  int local_8a8;
  int local_8a4;
  int local_8a0;
  int local_89c;
  int local_898;
  int local_894;
  int local_890;
  int local_88c;
  int local_888;
  int local_884;
  int local_880;
  undefined4 local_87c;
  int64_t local_878;
  TPZVec<long> local_870 [7];
  int local_774;
  int local_758;
  int local_754;
  TPZVec<int> local_750 [4];
  int local_6bc;
  TPZVec<int> local_6b8 [2];
  size_t in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff990;
  int iVar8;
  undefined4 in_stack_fffffffffffff994;
  int iVar9;
  TPZVec<int> local_668 [11];
  undefined4 local_4fc;
  TPZVec<int> local_4f8 [2];
  int local_4ac;
  int local_4a8;
  int local_4a4;
  TPZVec<int> local_380 [9];
  TPZVec<int> local_250 [9];
  TPZVec<int> local_130 [9];
  undefined8 local_10;
  long local_8;
  
  local_10 = 0x3f;
  local_8 = in_RDI;
  TPZManVector<int,_63>::TPZManVector
            ((TPZManVector<int,_63> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588);
  TPZManVector<int,_63>::TPZManVector
            ((TPZManVector<int,_63> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588);
  TPZManVector<int,_63>::TPZManVector
            ((TPZManVector<int,_63> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588);
  TPZManVector<int,_63>::TPZManVector
            ((TPZManVector<int,_63> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588);
  pztopology::TPZPrism::GetSideHDivDirections
            (&in_stack_fffffffffffff5a0->super_TPZVec<int>,in_stack_fffffffffffff598,
             &in_stack_fffffffffffff590->super_TPZVec<int>,in_stack_fffffffffffff588);
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar2 == 0) {
    pzinternal::DebugStopImpl
              ((char *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
               in_stack_fffffffffffff988);
  }
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),5);
  local_4a4 = *piVar3;
  local_4a8 = pzshape::TPZShapePrism::NShapeF(&in_stack_fffffffffffff570->super_TPZVec<int>);
  local_4ac = 0;
  TPZVec<int>::size(local_130);
  local_4fc = 0x14;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffff5a0,(int64_t)in_stack_fffffffffffff598,
             (int *)in_stack_fffffffffffff590);
  TPZManVector<int,_81>::TPZManVector(in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588);
  iVar9 = 0;
  for (iVar8 = 0; iVar1 = iVar9, iVar8 < 0x15; iVar8 = iVar8 + 1) {
    iVar1 = pztopology::TPZPrism::SideDimension(0x18b0490);
    if (iVar1 == 2) {
      TPZStack<int,_10>::TPZStack(in_stack_fffffffffffff580);
      pztopology::TPZPrism::LowerDimensionSides
                ((int)((ulong)in_stack_fffffffffffff580 >> 0x20),
                 (TPZStack<int,_10> *)in_stack_fffffffffffff578);
      iVar2 = TPZVec<int>::NElements(local_6b8);
      local_6bc = (int)iVar2 + 1;
      TPZManVector<int,_27>::TPZManVector
                ((TPZManVector<int,_27> *)in_stack_fffffffffffff590,
                 (int64_t)in_stack_fffffffffffff588);
      HDivPermutation((int)((ulong)in_stack_fffffffffffff610 >> 0x20),in_stack_fffffffffffff608,
                      in_stack_fffffffffffff600);
      local_754 = iVar9;
      iVar9 = local_754;
      for (local_758 = 0; local_758 < local_6bc; local_758 = local_758 + 1) {
        piVar3 = TPZVec<int>::operator[](local_750,(long)local_758);
        iVar1 = *piVar3 + local_754;
        piVar3 = TPZVec<int>::operator[](local_668,(long)(local_754 + local_758));
        *piVar3 = iVar1;
        iVar1 = iVar8;
        piVar3 = TPZVec<int>::operator[](local_4f8,(long)iVar9);
        *piVar3 = iVar8;
        iVar9 = iVar9 + 1;
        iVar8 = iVar1;
      }
      TPZManVector<int,_27>::~TPZManVector((TPZManVector<int,_27> *)in_stack_fffffffffffff570);
      TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x18b06b3);
    }
  }
  while (local_4ac = iVar1, lVar4 = (long)iVar9, iVar2 = TPZVec<int>::size(local_668), lVar4 < iVar2
        ) {
    iVar1 = iVar9;
    piVar3 = TPZVec<int>::operator[](local_668,(long)iVar9);
    *piVar3 = iVar9;
    iVar9 = iVar1 + 1;
    iVar1 = local_4ac;
  }
  TPZGenMatrix<int>::TPZGenMatrix
            ((TPZGenMatrix<int> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588,
             (int64_t)in_stack_fffffffffffff580);
  pzshape::TPZShapePrism::ShapeOrder
            (in_stack_fffffffffffff5f0,
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
             in_stack_fffffffffffff5e0);
  piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),5);
  local_774 = *piVar3 + 1;
  TPZManVector<long,_27>::TPZManVector
            ((TPZManVector<long,_27> *)in_stack_fffffffffffff590,(int64_t)in_stack_fffffffffffff588)
  ;
  FirstShapeIndex((TPZVec<long> *)in_stack_fffffffffffff590,(int *)in_stack_fffffffffffff588);
  local_878 = TPZVec<int>::NElements(local_130);
  iVar9 = 0;
  local_87c = 0xf;
  for (local_880 = 0; local_880 < local_4ac; local_880 = local_880 + 1) {
    piVar3 = TPZVec<int>::operator[](local_668,(long)local_880);
    local_884 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_130,(long)local_884);
    local_888 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_4f8,(long)local_880);
    local_88c = *piVar3;
    local_890 = local_88c + -0xf;
    piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(local_8 + 0x2b50),(long)local_890);
    local_894 = *piVar3;
    plVar5 = TPZVec<long>::operator[](local_870,(long)local_888);
    local_898 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_870,(long)(local_888 + 1));
    local_89c = (int)*plVar5;
    for (local_8a0 = local_898; local_8a0 < local_89c; local_8a0 = local_8a0 + 1) {
      local_8a4 = pztopology::TPZPrism::SideDimension(0x18b09da);
      local_8a8 = 1;
      for (local_8ac = 0; local_8ac < local_8a4; local_8ac = local_8ac + 1) {
        piVar3 = TPZGenMatrix<int>::operator()
                           (in_stack_fffffffffffff578,(int64_t)in_stack_fffffffffffff570,
                            (int64_t)in_stack_fffffffffffff568);
        if (local_894 < *piVar3) {
          local_8a8 = 0;
        }
      }
      if (local_8a8 != 0) {
        local_8b4 = std::make_pair<int&,int&>(in_stack_fffffffffffff568,(int *)0x18b0ad8);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_8b4);
        iVar9 = iVar9 + 1;
      }
    }
  }
  for (local_8b8 = local_4ac; local_8b8 < local_878; local_8b8 = local_8b8 + 1) {
    piVar3 = TPZVec<int>::operator[](local_668,(long)local_8b8);
    local_8bc = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_130,(long)local_8bc);
    local_8c0 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_250,(long)local_8bc);
    local_8c4 = *piVar3;
    piVar3 = TPZVec<int>::operator[](local_380,(long)local_8bc);
    local_8c8 = *piVar3;
    local_8cc = pztopology::TPZPrism::Type(local_8c0);
    plVar5 = TPZVec<long>::operator[](local_870,(long)local_8c0);
    local_8d0 = (int)*plVar5;
    plVar5 = TPZVec<long>::operator[](local_870,(long)(local_8c0 + 1));
    local_8d4 = (int)*plVar5;
    for (local_8d8 = local_8d0; local_8d8 < local_8d4; local_8d8 = local_8d8 + 1) {
      local_8dc = pztopology::TPZPrism::SideDimension(0x18b0cfe);
      local_8f4[3] = local_4a4;
      local_8e4 = local_4a4;
      local_8e0 = local_4a4;
      if (local_8c4 != 0) {
        local_8f4[(long)local_8c8 + 3] = local_8f4[(long)local_8c8 + 3] + 1;
      }
      memset(local_8f4,0,0xc);
      local_8f8 = 1;
      for (local_8fc = 0; local_8fc < local_8dc; local_8fc = local_8fc + 1) {
        if ((local_8cc == ETriangle) || (local_8cc == ETetraedro)) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff578,(int64_t)in_stack_fffffffffffff570,
                              (int64_t)in_stack_fffffffffffff568);
          local_8f4[local_8fc] = *piVar3;
          local_900 = local_8f4[(long)local_8fc + 3] + 1;
          if (local_900 < local_8f4[local_8fc]) {
            local_8f8 = 0;
          }
        }
        else if (local_8cc == EQuadrilateral) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff578,(int64_t)in_stack_fffffffffffff570,
                              (int64_t)in_stack_fffffffffffff568);
          local_8f4[local_8fc] = *piVar3;
          local_904 = local_8f4[(long)local_8fc + 3];
          if (local_904 < local_8f4[local_8fc]) {
            local_8f8 = 0;
          }
        }
        else if (local_8cc == ECube) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff578,(int64_t)in_stack_fffffffffffff570,
                              (int64_t)in_stack_fffffffffffff568);
          local_8f4[local_8fc] = *piVar3;
          if (local_8f4[(long)local_8fc + 3] < local_8f4[local_8fc]) {
            local_8f8 = 0;
          }
        }
        else if (local_8cc == EPrisma) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff578,(int64_t)in_stack_fffffffffffff570,
                              (int64_t)in_stack_fffffffffffff568);
          if (local_8f4[(long)local_8fc + 3] < *piVar3) {
            local_8f8 = 0;
          }
        }
        else if (local_8cc == EOned) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff578,(int64_t)in_stack_fffffffffffff570,
                              (int64_t)in_stack_fffffffffffff568);
          local_8f4[0] = *piVar3;
          if (local_8f4[(long)local_8fc + 3] < *piVar3) {
            local_8f8 = 0;
          }
        }
        else if (local_8cc == EPiramide) {
          piVar3 = TPZGenMatrix<int>::operator()
                             (in_stack_fffffffffffff578,(int64_t)in_stack_fffffffffffff570,
                              (int64_t)in_stack_fffffffffffff568);
          local_8f4[local_8fc] = *piVar3;
          if (local_8f4[(long)local_8fc + 3] < local_8f4[local_8fc]) {
            local_8f8 = 0;
          }
        }
        else {
          pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffff988);
        }
      }
      if (local_8f8 != 0) {
        local_90c = std::make_pair<int&,int&>(in_stack_fffffffffffff568,(int *)0x18b109c);
        ppVar6 = TPZVec<std::pair<int,_long>_>::operator[]
                           ((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510),(long)iVar9);
        std::pair<int,long>::operator=((pair<int,long> *)ppVar6,&local_90c);
        iVar9 = iVar9 + 1;
      }
    }
  }
  iVar2 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(local_8 + 0x3510));
  if (iVar9 != (int)iVar2) {
    poVar7 = std::operator<<((ostream *)&std::cout,"count ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
    in_stack_fffffffffffff570 = (TPZManVector<int,_81> *)std::operator<<(poVar7,"\nivs ");
    this = (void *)std::ostream::operator<<(in_stack_fffffffffffff570,(int)iVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl((char *)CONCAT44(iVar9,iVar8),in_stack_fffffffffffff988);
  }
  TPZManVector<long,_27>::~TPZManVector((TPZManVector<long,_27> *)in_stack_fffffffffffff570);
  TPZGenMatrix<int>::~TPZGenMatrix((TPZGenMatrix<int> *)in_stack_fffffffffffff570);
  TPZManVector<int,_81>::~TPZManVector(in_stack_fffffffffffff570);
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffff570);
  TPZManVector<int,_63>::~TPZManVector((TPZManVector<int,_63> *)in_stack_fffffffffffff570);
  TPZManVector<int,_63>::~TPZManVector((TPZManVector<int,_63> *)in_stack_fffffffffffff570);
  TPZManVector<int,_63>::~TPZManVector((TPZManVector<int,_63> *)in_stack_fffffffffffff570);
  TPZManVector<int,_63>::~TPZManVector((TPZManVector<int,_63> *)in_stack_fffffffffffff570);
  return;
}

Assistant:

void TPZShapeHDiv<TSHAPE>::ComputeVecandShape(TPZShapeData &data) {
    const int64_t numvec = TSHAPE::Dimension*TSHAPE::NSides;
    TPZManVector<int,numvec> VectorSides(numvec),bilinear(numvec),directions(numvec);
    TPZManVector<int,numvec> normalsides(numvec);

    TSHAPE::GetSideHDivDirections(VectorSides,directions,bilinear,normalsides);

    if (data.fSDVecShapeIndex.size() == 0) {
        DebugStop();
    }
    
    // const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];//TODOPHIL
    const int pressureorder = data.fHDivConnectOrders[TSHAPE::NFacets];

    int nshape = TSHAPE::NShapeF(data.fH1ConnectOrders);

    int nexternalvectors = 0;
    TPZManVector<int> facevector(VectorSides.size(),TSHAPE::NSides-1);
    // compute the permutation which needs to be applied to the vectors to enforce compatibility between neighbours
    TPZManVector<int,81> vecpermute(TSHAPE::NSides*TSHAPE::Dimension);
    if (TSHAPE::Type() == EPiramide) {
        DebugStop();
    }
    int count = 0;
    for (int side = 0; side < TSHAPE::NSides; side++) {
        if (TSHAPE::SideDimension(side) != TSHAPE::Dimension -1) {
            continue;
        }
        TPZStack<int> smallsides;
        TSHAPE::LowerDimensionSides(side,smallsides);
//        TPZGeoElSide gelside(gel,side);
//        int nlowdim = gelside.NSides();
        const int nlowdim = smallsides.NElements()+1;
        TPZManVector<int,27> permgather(nlowdim);
        HDivPermutation(side,data, permgather);
        int counthold = count;
        for (int i=0; i<nlowdim; i++) {
            vecpermute[counthold+i] = permgather[i]+counthold;
            facevector[count] = side;
            count++;
        }
    }

    nexternalvectors = count;
    for (; count < vecpermute.size(); count++) {
        vecpermute[count] = count;
    }
    TPZGenMatrix<int> shapeorders(nshape,3);
    TSHAPE::ShapeOrder(data.fCornerNodeIds, data.fH1ConnectOrders, shapeorders);

//    int nshapeflux = NFluxShapeF();
//    IndexVecShape.Resize(nshapeflux);

    int scalarorder = data.fHDivConnectOrders[TSHAPE::NFacets]+1;
    // VectorSide indicates the side associated with each vector entry
    TPZManVector<int64_t,27> FirstIndex(TSHAPE::NSides+1);
    // the first index of the shape functions
    FirstShapeIndex(FirstIndex,scalarorder);

    int64_t nvec = VectorSides.NElements();
    count = 0;

    const int firstface = TSHAPE::NSides-TSHAPE::NFacets-1;
    for (int locvec = 0; locvec<nexternalvectors; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int face = facevector[locvec];
//        int connectindex = SideConnectLocId(0, face);
        int connectindex = face-firstface;
//        int order = this->Connect(connectindex).Order();
        //int order = data.fHDivConnectOrders[connectindex];
        int order = data.fHDivConnectOrders[connectindex];//TODOPHIL

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (shapeorders(ish,d) > order) {
                    include = false;
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }


    for (int locvec = nexternalvectors; locvec<nvec; locvec++) {
        int ivec = vecpermute[locvec];
        int side = VectorSides[ivec];
        int bil = bilinear[ivec];
        int dir = directions[ivec];
        MElementType tipo = TSHAPE::Type(side);

        int firstshape = FirstIndex[side];
        int lastshape = FirstIndex[side+1];

        for (int ish = firstshape; ish<lastshape; ish++) {
            int sidedimension = TSHAPE::SideDimension(side);
            int maxorder[3] = {pressureorder,pressureorder,pressureorder};
            if (bil) {
                maxorder[dir]++;
            }
            int shord[3] = {0};
            int include=true;
            for (int d=0; d<sidedimension; d++)
            {
                if (tipo==ETriangle||tipo==ETetraedro)//
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d]+1;
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==EQuadrilateral)
                {
                    shord[d] = shapeorders(ish,d);
                    int maxd = maxorder[d];
                    if (shord[d] > maxd) {
                        include = false;
                    }
                }
                else if(tipo==ECube)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo==EPrisma)
                {
                    //DebugStop();
                    if (shapeorders(ish,d) > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EOned)
                {
                    shord[0] = shapeorders(ish,0);
                    if (shord[0] > maxorder[d]) {
                        include = false;
                    }
                }
                else if (tipo == EPiramide)
                {
                    shord[d] = shapeorders(ish,d);
                    if (shord[d] > maxorder[d]) {
                        include = false;
                    }
                }
                else
                {
                    DebugStop();
                }
            }
            if (include)
            {
                data.fSDVecShapeIndex[count] = std::make_pair(ivec, ish);
                count++;
            }
        }
    }

    int ivs =  data.fSDVecShapeIndex.size();
    if (count != ivs) {
        std::cout<<"count "<<count
                 <<"\nivs "<<ivs<<std::endl;
        DebugStop();
    }
    
}